

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

void __thiscall nuraft::buffer::get(buffer *this,ptr<buffer> *dst)

{
  uint uVar1;
  element_type *peVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  size_t __n;
  
  peVar2 = (dst->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(uint *)peVar2;
  if ((int)uVar1 < 0) {
    uVar5 = uVar1 & 0x7fffffff;
  }
  else {
    uVar5 = (uint)*(ushort *)peVar2;
  }
  if ((int)uVar1 < 0) {
    uVar6 = *(uint *)(peVar2 + 4);
  }
  else {
    uVar6 = (uint)*(ushort *)(peVar2 + 2);
  }
  if ((int)uVar1 < 0) {
    lVar3 = (ulong)*(uint *)(peVar2 + 4) + 8;
  }
  else {
    lVar3 = (ulong)*(ushort *)(peVar2 + 2) + 4;
  }
  __n = (ulong)uVar5 - (ulong)uVar6;
  if (*(int *)this < 0) {
    lVar4 = (ulong)*(uint *)(this + 4) + 8;
  }
  else {
    lVar4 = (ulong)*(ushort *)(this + 2) + 4;
  }
  memcpy(peVar2 + lVar3,this + lVar4,__n);
  if (*(int *)this < 0) {
    *(int *)(this + 4) = *(int *)(this + 4) + (int)__n;
  }
  else {
    *(short *)(this + 2) = *(short *)(this + 2) + (short)__n;
  }
  return;
}

Assistant:

void buffer::get(ptr<buffer>& dst) {
    size_t sz = dst->size() - dst->pos();
    ::memcpy(dst->data(), data(), sz);
    __mv_fw_block(this, sz);
}